

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O2

lzma_filter_encoder * encoder_find(lzma_vli id)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x38 == 0x230) {
      return (lzma_filter_encoder *)0x0;
    }
    lVar1 = lVar2 + 0x38;
  } while (*(lzma_vli *)((long)&encoders[0].id + lVar2) != id);
  return (lzma_filter_encoder *)((long)&encoders[0].id + lVar2);
}

Assistant:

static const lzma_filter_encoder *
encoder_find(lzma_vli id)
{
	for (size_t i = 0; i < ARRAY_SIZE(encoders); ++i)
		if (encoders[i].id == id)
			return encoders + i;

	return NULL;
}